

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  bool bVar1;
  pointer dir;
  cmListFileBacktrace lfbt;
  allocator local_c9;
  string local_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_70;
  
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    GetBacktrace(&local_a8,this);
    std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
    cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
    emplace_back<cmValueWithOrigin>(&this->IncludeDirectoriesEntries,&local_70);
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      GetBacktrace(&local_a8,this);
      std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
      cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
      emplace_back<cmValueWithOrigin>(&this->CompileOptionsEntries,&local_70);
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (!bVar1) {
        bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
        if (bVar1) {
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&local_70,value,(allocator *)&local_c8);
          cmSystemTools::ExpandListArgument
                    (&local_70.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_a8,false);
          std::__cxx11::string::~string((string *)&local_70);
          for (dir = local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              dir != local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     _M_impl.super__Vector_impl_data._M_finish; dir = (pointer)&dir->FilePath) {
            AddLinkDirectory(this,&dir->Name);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          return;
        }
        cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
        return;
      }
      GetBacktrace(&local_a8,this);
      std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
      cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
      emplace_back<cmValueWithOrigin>(&this->CompileDefinitionsEntries,&local_70);
    }
  }
  cmValueWithOrigin::~cmValueWithOrigin(&local_70);
  std::__cxx11::string::~string((string *)&local_c8);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileDefinitionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    cmSystemTools::ExpandListArgument(value, varArgsExpanded);
    for(std::vector<std::string>::const_iterator vi = varArgsExpanded.begin();
        vi != varArgsExpanded.end(); ++vi)
      {
      this->AddLinkDirectory(*vi);
      }
    return;
    }

  this->Properties.AppendProperty(prop, value, asString);
}